

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::processAttributeGroupRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName,ComplexTypeInfo *typeInfo)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  short *psVar1;
  XMLCh XVar2;
  SchemaInfo *pSVar3;
  XSAnnotation *pXVar4;
  XMLStringPool *pXVar5;
  ValueVectorOf<int> *pVVar6;
  SchemaInfo *pSVar7;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar8;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar9;
  DOMElement **ppDVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  DOMElement *pDVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *text1;
  SchemaInfo *toRestore;
  ulong uVar16;
  XercesAttGroupInfo *fromAttGroup;
  XMLCh *pXVar17;
  XMLSize_t XVar18;
  XMLCh *name;
  XMLCh XVar19;
  ulong uVar20;
  ulong uVar21;
  XMLCh *pXVar22;
  XMLSize_t getAt;
  RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *pRVar23;
  NamespaceScopeManager nsMgr;
  ListType local_80;
  NamespaceScopeManager local_40;
  
  pSVar3 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar3;
  pDVar15 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar15 = checkContent(this,elem,pDVar15,true,true);
  if (pDVar15 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x1f,L"attributeGroup"
                      ,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  pXVar4 = this->fAnnotation;
  iVar13 = XMLString::indexOf(refName,L':');
  if (iVar13 + 1U < 2) {
    pXVar22 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,refName,(long)iVar13);
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar14 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar14);
    pXVar22 = (XMLCh *)CONCAT44(extraout_var,iVar13);
  }
  iVar13 = XMLString::indexOf(refName,L':');
  XVar18 = 0;
  if (refName != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)refName + XVar18);
      XVar18 = XVar18 + 2;
    } while (*psVar1 != 0);
    XVar18 = ((long)XVar18 >> 1) - 1;
  }
  if (XVar18 == (long)(iVar13 + 1)) {
    name = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar13 == -1) {
      this_00->fIndex = 0;
      XMLBuffer::append(this_00,refName,XVar18);
    }
    else {
      this_00->fIndex = 0;
      XMLBuffer::append(this_00,refName + (long)iVar13 + 1,XVar18 + ~(long)iVar13);
    }
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar14 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar14);
    name = (XMLCh *)CONCAT44(extraout_var_00,iVar13);
  }
  text1 = resolvePrefixToURI(this,elem,pXVar22);
  enclosingSchema = &this->fSchemaInfo;
  pSVar3 = this->fSchemaInfo;
  uVar14 = this->fCurrentScope;
  pXVar22 = this->fTargetNSURIString;
  if (text1 == pXVar22) {
LAB_0032a79c:
    pRVar9 = this->fAttGroupRegistry;
    if ((name == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*name, uVar16 == 0)) {
      uVar16 = 0;
    }
    else {
      XVar19 = name[1];
      if (XVar19 != L'\0') {
        pXVar22 = name + 2;
        do {
          uVar16 = (ulong)(ushort)XVar19 + (uVar16 >> 0x18) + uVar16 * 0x26;
          XVar19 = *pXVar22;
          pXVar22 = pXVar22 + 1;
        } while (XVar19 != L'\0');
      }
      uVar16 = uVar16 % pRVar9->fHashModulus;
    }
    pRVar23 = pRVar9->fBucketList[uVar16];
    local_80 = INCLUDE;
    if (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
      do {
        bVar12 = StringHasher::equals((StringHasher *)&pRVar9->field_0x30,name,pRVar23->fKey);
        if (bVar12) {
          fromAttGroup = pRVar23->fData;
          if (fromAttGroup != (XercesAttGroupInfo *)0x0) goto LAB_0032a8df;
          break;
        }
        pRVar23 = pRVar23->fNext;
      } while (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0);
    }
LAB_0032a83d:
    pDVar15 = SchemaInfo::getTopLevelComponent
                        (*enclosingSchema,4,L"attributeGroup",name,enclosingSchema);
    if (pDVar15 != (DOMElement *)0x0) {
      uVar16 = this->fDeclStack->fCurCount;
      if (uVar16 == 0) {
LAB_0032a95f:
        fromAttGroup = traverseAttributeGroupDecl(this,pDVar15,typeInfo,true);
        if ((fromAttGroup != (XercesAttGroupInfo *)0x0) &&
           (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0)) {
          copyAttGroupAttributes
                    (this,elem,fromAttGroup,this->fCurrentAttGroupInfo,(ComplexTypeInfo *)0x0);
        }
        if (pSVar3 != *enclosingSchema) {
          restoreSchemaInfo(this,pSVar3,local_80,uVar14);
        }
      }
      else {
        ppDVar10 = this->fDeclStack->fElemList;
        if (*ppDVar10 != pDVar15) {
          uVar21 = 1;
          do {
            uVar20 = uVar21;
            if (uVar16 == uVar20) break;
            uVar21 = uVar20 + 1;
          } while (ppDVar10[uVar20] != pDVar15);
          if (uVar16 <= uVar20) goto LAB_0032a95f;
        }
        fromAttGroup = (XercesAttGroupInfo *)0x0;
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x56,refName,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      goto LAB_0032a9ff;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x67,L"attributeGroup",
                      text1,name,(XMLCh *)0x0);
    fromAttGroup = (XercesAttGroupInfo *)0x0;
  }
  else {
    pXVar17 = text1;
    if (pXVar22 == (XMLCh *)0x0 || text1 == (XMLCh *)0x0) {
      if (text1 == (XMLCh *)0x0) {
        if (pXVar22 == (XMLCh *)0x0) goto LAB_0032a79c;
LAB_0032a6cb:
        XVar19 = *pXVar22;
      }
      else {
        XVar19 = *text1;
        if ((pXVar22 != (XMLCh *)0x0) && (XVar19 == L'\0')) goto LAB_0032a6cb;
      }
      if (XVar19 == L'\0') goto LAB_0032a79c;
    }
    else {
      do {
        XVar19 = *pXVar17;
        if (XVar19 == L'\0') goto LAB_0032a6cb;
        XVar2 = *pXVar22;
        pXVar22 = pXVar22 + 1;
        pXVar17 = pXVar17 + 1;
      } while (XVar19 == XVar2);
    }
    iVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                       (this->fURIStringPool,text1);
    pVVar6 = this->fImportedNSList;
    if ((pVVar6 == (ValueVectorOf<int> *)0x0) || (uVar16 = pVVar6->fCurCount, uVar16 == 0)) {
LAB_0032a9db:
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,text1,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_0032a9ff;
    }
    if (*pVVar6->fElemList != iVar13) {
      uVar21 = 0;
      do {
        if (uVar16 - 1 == uVar21) goto LAB_0032a9db;
        uVar20 = uVar21 + 1;
        lVar11 = uVar21 + 1;
        uVar21 = uVar20;
      } while (pVVar6->fElemList[lVar11] != iVar13);
      if (uVar16 <= uVar20) goto LAB_0032a9db;
    }
    fromAttGroup = traverseAttributeGroupDeclNS(this,elem,text1,name);
    if (fromAttGroup == (XercesAttGroupInfo *)0x0) {
      pSVar7 = this->fSchemaInfo;
      iVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,text1);
      pRVar8 = pSVar7->fImportedInfoList;
      if ((pRVar8 != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
         (XVar18 = (pRVar8->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount, XVar18 != 0))
      {
        getAt = 0;
        do {
          toRestore = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                (&pSVar7->fImportedInfoList->
                                  super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
          if (toRestore->fTargetNSURI == iVar13) {
            if (toRestore->fProcessed != true) {
              local_80 = IMPORT;
              restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
              goto LAB_0032a83d;
            }
            break;
          }
          getAt = getAt + 1;
        } while (XVar18 != getAt);
      }
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x67,L"attributeGroup"
                        ,text1,name,(XMLCh *)0x0);
      fromAttGroup = (XercesAttGroupInfo *)0x0;
      goto LAB_0032a9ff;
    }
LAB_0032a8df:
    local_80 = INCLUDE;
    copyAttGroupAttributes(this,elem,fromAttGroup,this->fCurrentAttGroupInfo,typeInfo);
  }
  if (pSVar3 != *enclosingSchema) {
    restoreSchemaInfo(this,pSVar3,local_80,0xfffffffe);
  }
LAB_0032a9ff:
  if (pXVar4 != (XSAnnotation *)0x0) {
    (*(pXVar4->super_XSerializable)._vptr_XSerializable[1])(pXVar4);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return fromAttGroup;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::processAttributeGroupRef(const DOMElement* const elem,
                                         const XMLCh* const refName,
                                         ComplexTypeInfo* const typeInfo) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem ,XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ATTRIBUTEGROUP);
    }

    Janitor<XSAnnotation> janAnnot(fAnnotation);
    const                XMLCh* prefix = getPrefix(refName);
    const                XMLCh* localPart = getLocalPart(refName);
    const                XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    XercesAttGroupInfo*  attGroupInfo = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        attGroupInfo = traverseAttributeGroupDeclNS(elem, uriStr, localPart);

        if (!attGroupInfo) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                                  SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else {

        attGroupInfo = fAttGroupRegistry->get(localPart);
    }

    if (!attGroupInfo) {

        // traverse top level attributeGroup - if found
        DOMElement* attGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_AttributeGroup,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP, localPart, &fSchemaInfo);

        if (attGroupElem != 0) {

            // circular attribute check
            if (fDeclStack->containsElement(attGroupElem)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, refName);
                return 0;
            }

            attGroupInfo = traverseAttributeGroupDecl(attGroupElem, typeInfo, true);

            if (attGroupInfo && fCurrentAttGroupInfo) {
                copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, 0);
            }

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }

            return attGroupInfo;
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNotFound,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, uriStr, localPart);
        }
    }

    if (attGroupInfo) {
        copyAttGroupAttributes(elem, attGroupInfo, fCurrentAttGroupInfo, typeInfo);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType);
    }

    return attGroupInfo;
}